

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamEncoder.cpp
# Opt level: O1

void generate_flux(TrackData *trackdata)

{
  DataRate DVar1;
  bool bVar2;
  uint8_t uVar3;
  int iVar4;
  BitBuffer *this;
  char *pcVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int iVar6;
  int iVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint32_t flux_time;
  uint local_7c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  uint local_5c;
  FluxData local_58;
  TrackData *local_38;
  
  local_38 = trackdata;
  this = TrackData::bitstream(trackdata);
  DVar1 = this->datarate;
  if ((int)DVar1 < 500000) {
    if (DVar1 == _250K) {
      iVar7 = 2000;
      goto LAB_00142a1f;
    }
    if (DVar1 == _300K) {
      iVar7 = 0x683;
      goto LAB_00142a1f;
    }
  }
  else {
    if (DVar1 == _500K) {
      iVar7 = 1000;
      goto LAB_00142a1f;
    }
    if (DVar1 == _1M) {
      iVar7 = 500;
      goto LAB_00142a1f;
    }
  }
  iVar7 = 0;
LAB_00142a1f:
  BitBuffer::seek(this,0);
  local_7c = 0;
  local_58.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar4 = BitBuffer::size(this);
  pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(long)iVar4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_78,(size_type)pvVar8);
  uVar3 = '\0';
  uVar9 = '\0';
  while( true ) {
    uVar10 = uVar3;
    bVar2 = BitBuffer::wrapped(this);
    if (bVar2) break;
    uVar3 = BitBuffer::read1(this);
    local_7c = local_7c + iVar7;
    iVar4 = extraout_EDX;
    if (uVar10 != '\0') {
      pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((local_38->cylhead).cyl < 0x28) {
        if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,
                     (iterator)
                     local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_7c);
          iVar4 = extraout_EDX_00;
        }
        else {
          *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_7c;
          pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish + 1);
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)pvVar8;
        }
        local_7c = 0;
      }
      else {
        iVar6 = 0xf0;
        if (uVar9 == '\0') {
          iVar6 = -0xf0;
        }
        if (uVar9 == uVar3) {
          iVar6 = 0;
        }
        local_5c = local_7c + iVar6;
        if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_78,
                     (iterator)
                     local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_5c);
          iVar4 = extraout_EDX_01;
        }
        else {
          *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_5c;
          pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish + 1);
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)pvVar8;
        }
        local_7c = -iVar6;
      }
    }
    pcVar5 = BitBuffer::index(this,(char *)pvVar8,iVar4);
    uVar9 = uVar10;
    if ((char)pcVar5 != '\0') {
      pvVar8 = &local_78;
      std::
      vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
      ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  *)&local_58,pvVar8);
      if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  if ((local_58.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_58.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    std::
    vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
    ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                *)&local_58,&local_78);
  }
  TrackData::add(local_38,&local_58,true);
  if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0
     ) {
    operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void generate_flux(TrackData& trackdata)
{
    uint8_t last_bit{ 0 }, curr_bit{ 0 };
    auto& bitbuf = trackdata.bitstream();
    auto ns_per_bitcell = bitcell_ns(bitbuf.datarate);
    bitbuf.seek(0);

    uint32_t flux_time{ 0 };
    FluxData flux_data{};
    std::vector<uint32_t> flux_times{};
    flux_times.reserve(bitbuf.size());

    while (!bitbuf.wrapped())
    {
        auto next_bit{ bitbuf.read1() };

        flux_time += ns_per_bitcell;
        if (curr_bit)
        {
            if (trackdata.cylhead.cyl < 40)
            {
                flux_times.push_back(flux_time);
                flux_time = 0;
            }
            else
            {
                auto pre_comp_ns{ (last_bit == next_bit) ? 0 : (last_bit ? +240 : -240) };
                flux_times.push_back(flux_time + pre_comp_ns);
                flux_time = 0 - pre_comp_ns;
            }
        }

        last_bit = curr_bit;
        curr_bit = next_bit;

        if (bitbuf.index())
        {
            flux_data.push_back(std::move(flux_times));
            flux_times.clear();
        }
    }

    if (flux_data.empty() || !flux_times.empty())
        flux_data.push_back(std::move(flux_times));

    trackdata.add(std::move(flux_data), true);
}